

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRequest.cpp
# Opt level: O0

void xmrig::JsonRequest::create(Document *doc,int64_t id,char *method,Value *params)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  GenericStringRef<char> local_88 [2];
  GenericStringRef<char> local_68;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffffa8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffb0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffffb8;
  StringRefType *in_stack_ffffffffffffffc0;
  StringRefType *in_stack_ffffffffffffffc8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffd0;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(in_RDI);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>
            ((GenericStringRef<char> *)&stack0xffffffffffffffc8,(char (*) [3])0x2790a3);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_ffffffffffffffc0,(StringRefType *)in_stack_ffffffffffffffb8,
                  (long)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>
            ((GenericStringRef<char> *)&stack0xffffffffffffffb8,(char (*) [8])"jsonrpc");
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>
            ((GenericStringRef<char> *)&stack0xffffffffffffffa8,(char (*) [4])"2.0");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
            in_stack_ffffffffffffffb8);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_68,(char (*) [7])0x27c44b);
  rapidjson::StringRef<char>((char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
            in_stack_ffffffffffffffb8);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(local_88,(char (*) [7])0x27c822);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffffc0,(StringRefType *)in_stack_ffffffffffffffb8,
            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void xmrig::JsonRequest::create(rapidjson::Document &doc, int64_t id, const char *method, rapidjson::Value &params)
{
    auto &allocator = doc.GetAllocator();

    doc.AddMember("id",      id, allocator);
    doc.AddMember("jsonrpc", "2.0", allocator);
    doc.AddMember("method",  rapidjson::StringRef(method), allocator);
    doc.AddMember("params",  params, allocator);
}